

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O3

VariableData * FindGlobalAt(ExpressionContext *exprCtx,uint offset)

{
  TypeBase **ppTVar1;
  VariableData *pVVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ScopeData *pSVar7;
  
  uVar4 = (ulong)(exprCtx->variables).count;
  if (uVar4 == 0) {
    return (VariableData *)0x0;
  }
  uVar5 = 0;
  do {
    pVVar2 = (exprCtx->variables).data[uVar5];
    uVar6 = 0;
    if (pVVar2->importModule != (ModuleData *)0x0) {
      uVar6 = pVVar2->importModule->importIndex;
    }
    pSVar7 = pVVar2->scope;
    if ((pSVar7 != (ScopeData *)0x0) && (pSVar7->type != SCOPE_TEMPORARY)) {
      while (pSVar7->scope != (ScopeData *)0x0) {
        if ((pSVar7->ownerFunction != (FunctionData *)0x0) ||
           (ppTVar1 = &pSVar7->ownerType, pSVar7 = pSVar7->scope, *ppTVar1 != (TypeBase *)0x0))
        goto LAB_0028741d;
      }
      if ((uVar6 == offset >> 0x18) && (pVVar2->offset <= (offset & 0xffffff))) {
        lVar3 = pVVar2->type->size;
        if (lVar3 == 0) {
          return pVVar2;
        }
        if ((long)(ulong)(offset & 0xffffff) < (long)(lVar3 + (ulong)pVVar2->offset)) {
          return pVVar2;
        }
      }
    }
LAB_0028741d:
    uVar5 = uVar5 + 1;
    if (uVar5 == uVar4) {
      return (VariableData *)0x0;
    }
  } while( true );
}

Assistant:

VariableData* FindGlobalAt(ExpressionContext &exprCtx, unsigned offset)
{
	unsigned targetModuleIndex = offset >> 24;

	if(targetModuleIndex)
		offset = offset & 0xffffff;

	for(unsigned i = 0; i < exprCtx.variables.size(); i++)
	{
		VariableData *variable = exprCtx.variables[i];

		unsigned variableModuleIndex = variable->importModule ? variable->importModule->importIndex : 0;

		if(IsGlobalScope(variable->scope) && variableModuleIndex == targetModuleIndex && offset >= variable->offset && (offset < variable->offset + variable->type->size || variable->type->size == 0))
			return variable;
	}

	return NULL;
}